

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_case::translate
          (method_case *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  value_type ptVar2;
  element_type *peVar3;
  _Elt_pointer pdVar4;
  size_t line;
  element_type *peVar5;
  pointer pcVar6;
  int iVar7;
  const_reference pptVar8;
  token_base **pptVar9;
  statement_case *this_00;
  _Elt_pointer pptVar10;
  exception *this_01;
  reference pvVar11;
  long lVar12;
  ulong uVar13;
  context_t *context_00;
  long lVar14;
  _Self __tmp;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  allocator_type local_179;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_178;
  string local_158;
  string local_138;
  string local_118;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_f8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_a8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_58;
  
  pptVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar2 = *pptVar8;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)ptVar2[1]._vptr_token_base;
  pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_f8);
  iVar7 = (*(*pptVar9)->_vptr_token_base[2])();
  if (iVar7 == 7) {
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
              (&local_f8,0);
    peVar3 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_178._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_178._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_first;
    local_178._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_178._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_node;
    lVar14 = (long)local_178._M_cur - (long)local_178._M_first;
    lVar12 = lVar14 >> 4;
    uVar1 = lVar12 * -0x3333333333333333 + 1;
    if (uVar1 < 6) {
      local_178._M_cur = local_178._M_cur + 1;
    }
    else {
      if (lVar14 < -0x4f) {
        uVar13 = ~((lVar12 * 0x3333333333333333 - 2U) / 6);
      }
      else {
        uVar13 = uVar1 / 6;
      }
      local_178._M_node = local_178._M_node + uVar13;
      local_178._M_first = *local_178._M_node;
      local_178._M_last = local_178._M_first + 6;
      local_178._M_cur = local_178._M_first + uVar13 * -6 + uVar1;
    }
    local_58._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_58._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_58._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_58._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::
    deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)&local_a8,&local_178,&local_58,&local_179);
    context_00 = &peVar3->context;
    translator_type::translate
              (&peVar3->translator,context_00,&local_a8,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_f8,false
              );
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque(&local_a8);
    this_00 = (statement_case *)
              statement_base::operator_new((statement_base *)0x30,(size_t)context_00);
    local_a8.
    super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)ptVar2[1]._vptr_token_base;
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_a8);
    pdVar4 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar10 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar10 ==
        (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar10 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_case::statement_case
              (this_00,(var *)(*pptVar9 + 1),
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_f8,
               context,pptVar10[-1]);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_f8);
    return &this_00->super_statement_base;
  }
  pdVar4 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar10 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar10 ==
      (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar10 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  line = pptVar10[-1]->line_num;
  this_01 = (exception *)__cxa_allocate_exception(0x90);
  peVar5 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar6 = (peVar5->file_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar6,pcVar6 + (peVar5->file_path)._M_string_length);
  pvVar11 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(&((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->file_buff,line - 1);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  pcVar6 = (pvVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar6,pcVar6 + pvVar11->_M_string_length);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"Case Tag must be a constant value.","");
  exception::exception(this_01,line,&local_118,&local_138,&local_158);
  __cxa_throw(this_01,&exception::typeinfo,exception::~exception);
}

Assistant:

statement_base *method_case::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data()->get_type() != token_types::value) {
			std::size_t line_num = static_cast<token_endline *>(raw.front().back())->get_line_num();
			const char *what = "Case Tag must be a constant value.";
			throw exception(line_num, context->file_path, context->file_buff.at(line_num - 1), what);
		}
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_case(static_cast<token_value *>(tree.root().data())->get_value(), body, context,
		                          raw.front().back());
	}